

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O0

int WebRtcIsac_DecodeSendBW(Bitstr *streamdata,int16_t *BWno)

{
  int16_t local_24 [2];
  int err;
  int BWno32;
  int16_t *BWno_local;
  Bitstr *streamdata_local;
  
  _err = BWno;
  BWno_local = (int16_t *)streamdata;
  streamdata_local._4_4_ =
       WebRtcIsac_DecHistOneStepMulti((int *)local_24,streamdata,kBwCdfPtr,kBwInitIndex,1);
  if (streamdata_local._4_4_ < 0) {
    streamdata_local._4_4_ = -0x19fa;
  }
  else {
    *_err = local_24[0];
  }
  return streamdata_local._4_4_;
}

Assistant:

int WebRtcIsac_DecodeSendBW(Bitstr* streamdata, int16_t* BWno) {
  int BWno32, err;

  /* entropy decoding of sender's BW estimation [0..23] */
  err = WebRtcIsac_DecHistOneStepMulti(&BWno32, streamdata, kBwCdfPtr,
                                       kBwInitIndex, 1);
  if (err < 0) {
    return -ISAC_RANGE_ERROR_DECODE_BANDWIDTH;
  }
  *BWno = (int16_t)BWno32;
  return err;
}